

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O2

unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>
wasm::Builder::makeMemory(Name name,Address initial,Address max,bool shared,Type indexType)

{
  undefined8 *puVar1;
  long lVar2;
  __uniq_ptr_data<wasm::Memory,_std::default_delete<wasm::Memory>,_true,_true> _Var3;
  undefined7 in_register_00000081;
  undefined8 in_stack_00000008;
  
  _Var3.super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
  super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
  super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl = name.super_IString.str._M_len;
  std::make_unique<wasm::Memory>();
  puVar1 = *(undefined8 **)
            _Var3.super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
            super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
            super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl;
  *puVar1 = name.super_IString.str._M_str;
  puVar1[1] = initial.addr;
  lVar2 = *(long *)_Var3.super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>.
                   _M_t.super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
                   super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl;
  *(address64_t *)(lVar2 + 0x38) = max.addr;
  *(ulong *)(lVar2 + 0x40) = CONCAT71(in_register_00000081,shared);
  *(char *)(lVar2 + 0x48) = (char)indexType.id;
  *(undefined8 *)(lVar2 + 0x50) = in_stack_00000008;
  return (__uniq_ptr_data<wasm::Memory,_std::default_delete<wasm::Memory>,_true,_true>)
         (tuple<wasm::Memory_*,_std::default_delete<wasm::Memory>_>)
         _Var3.super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
         super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
         super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl;
}

Assistant:

static std::unique_ptr<Memory> makeMemory(Name name,
                                            Address initial = 0,
                                            Address max = Memory::kMaxSize32,
                                            bool shared = false,
                                            Type indexType = Type::i32) {
    auto memory = std::make_unique<Memory>();
    memory->name = name;
    memory->initial = initial;
    memory->max = max;
    memory->shared = shared;
    memory->indexType = indexType;
    return memory;
  }